

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_moves(vector<Card,_std::allocator<Card>_> *cards)

{
  bool bVar1;
  ostream *poVar2;
  Card local_40 [4];
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_20;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_18;
  iterator it;
  vector<Card,_std::allocator<Card>_> *cards_local;
  
  it._M_current = (Card *)cards;
  poVar2 = std::operator<<((ostream *)&std::cout,"Printing moves....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::begin(cards);
  while( true ) {
    local_20._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(cards);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Card is ");
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator->
              (&local_18);
    Card::Card2Str_abi_cxx11_(local_40);
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_40);
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator++
              (&local_18);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_moves(std::vector<Card> cards)
{
    std::cout << "Printing moves...." << std::endl;
    for(std::vector<Card>::iterator it = cards.begin(); it != cards.end(); ++it) {
        std::cout << "Card is " << it->Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}